

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::DrawWaiting(DBaseStatusBar *this)

{
  FFont *font;
  DFrameBuffer *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *local_60;
  char *buff_p;
  char conbuff [64];
  int i;
  DBaseStatusBar *this_local;
  
  if (netgame) {
    local_60 = (char *)0x0;
    conbuff[0x3c] = '\0';
    conbuff[0x3d] = '\0';
    conbuff[0x3e] = '\0';
    conbuff[0x3f] = '\0';
    for (; this_00 = screen, font = SmallFont, (int)conbuff._60_4_ < 8;
        conbuff._60_4_ = conbuff._60_4_ + 1) {
      if (((playeringame[(int)conbuff._60_4_] & 1U) != 0) &&
         (((&DAT_01ae71b4)[(long)(int)conbuff._60_4_ * 0x2a0] & 1) != 0)) {
        if (local_60 == (char *)0x0) {
          strcpy((char *)&buff_p,"Waiting for:");
          local_60 = conbuff + 4;
        }
        pcVar4 = local_60 + 1;
        *local_60 = ' ';
        local_60 = local_60 + 2;
        *pcVar4 = (char)conbuff._60_4_ + '1';
        *local_60 = '\0';
      }
    }
    if (local_60 != (char *)0x0) {
      iVar1 = DCanvas::GetWidth((DCanvas *)screen);
      iVar2 = FFont::StringWidth(SmallFont,(char *)&buff_p);
      iVar2 = iVar2 * CleanXfac;
      iVar3 = FFont::GetHeight(SmallFont);
      DCanvas::DrawText((DCanvas *)this_00,font,8,(iVar1 - iVar2) / 2,iVar3 * CleanYfac,
                        (char *)&buff_p,0x40001393,1,0);
      BorderTopRefresh =
           (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
    }
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawWaiting () const
{
	int i;
	char conbuff[64], *buff_p;

	if (!netgame)
		return;

	buff_p = NULL;
	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i] && players[i].waiting)
		{
			if (buff_p == NULL)
			{
				strcpy (conbuff, "Waiting for:");
				buff_p = conbuff + 12;
			}
			*buff_p++ = ' ';
			*buff_p++ = '1' + i;
			*buff_p = 0;
		}
	}

	if (buff_p != NULL)
	{
		screen->DrawText (SmallFont, CR_ORANGE, 
			(screen->GetWidth() - SmallFont->StringWidth (conbuff)*CleanXfac) / 2,
			SmallFont->GetHeight()*CleanYfac, conbuff, DTA_CleanNoMove, true, TAG_DONE);
		BorderTopRefresh = screen->GetPageCount ();
	}
}